

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel_p.h
# Opt level: O3

void __thiscall
QFileSystemModelPrivate::QFileSystemNode::updateIcon
          (QFileSystemNode *this,QAbstractFileIconProvider *iconProvider,QString *path)

{
  QFileSystemNode *this_00;
  undefined8 uVar1;
  ulong uVar2;
  char cVar3;
  Data *pDVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QString local_70;
  QFileInfo local_58 [8];
  undefined1 local_50 [16];
  QFileSystemNode *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (iconProvider == (QAbstractFileIconProvider *)0x0) goto LAB_006175bd;
  if (this->info != (QExtendedInformation *)0x0) {
    QFileInfo::QFileInfo(local_58,(QString *)path);
    (*iconProvider->_vptr_QAbstractFileIconProvider[3])((QIcon *)local_50,iconProvider,local_58);
    uVar1 = local_50._0_8_;
    local_50._0_8_ = (QIconPrivate *)0x0;
    local_70.d.d = (Data *)(this->info->icon).d;
    (this->info->icon).d = (QIconPrivate *)uVar1;
    QIcon::~QIcon((QIcon *)&local_70);
    QIcon::~QIcon((QIcon *)local_50);
    QFileInfo::~QFileInfo(local_58);
  }
  pDVar4 = (this->children).d;
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
    uVar5 = 0;
LAB_0061749f:
    if (uVar5 == 0 && pDVar4 == (Data *)0x0) goto LAB_006175bd;
  }
  else {
    if (pDVar4->spans->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (pDVar4->numBuckets == uVar5) {
          pDVar4 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar2 = uVar5 + 1;
      } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
      goto LAB_0061749f;
    }
    uVar5 = 0;
  }
  do {
    this_00 = *(QFileSystemNode **)
               (pDVar4->spans[uVar5 >> 7].entries
                [pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f]].storage.data + 0x18);
    if ((path->d).size == 0) {
      updateIcon(this_00,iconProvider,&this_00->fileName);
    }
    else {
      cVar3 = QString::endsWith((QChar)(char16_t)path,0x2f);
      local_50._0_8_ = path;
      if (cVar3 == '\0') {
        local_50._8_2_ = 0x2f;
        local_40 = this_00;
        QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString_&>::convertTo<QString>
                  (&local_70,
                   (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString_&> *)local_50)
        ;
      }
      else {
        local_50._8_8_ = this_00;
        QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                  (&local_70,(QStringBuilder<const_QString_&,_QString_&> *)local_50);
      }
      updateIcon(this_00,iconProvider,&local_70);
      if ((QIconPrivate *)local_70.d.d != (QIconPrivate *)0x0) {
        LOCK();
        *(int *)&(local_70.d.d)->super_QArrayData = *(int *)&(local_70.d.d)->super_QArrayData + -1;
        UNLOCK();
        if (*(int *)&(local_70.d.d)->super_QArrayData == 0) {
          QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    do {
      if (pDVar4->numBuckets - 1 == uVar5) {
        uVar5 = 0;
        pDVar4 = (Data *)0x0;
        break;
      }
      uVar5 = uVar5 + 1;
    } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
  } while ((uVar5 != 0) || (pDVar4 != (Data *)0x0));
LAB_006175bd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void updateIcon(QAbstractFileIconProvider *iconProvider, const QString &path) {
            if (!iconProvider)
                return;

            if (info)
                info->icon = iconProvider->icon(QFileInfo(path));

            for (QFileSystemNode *child : std::as_const(children)) {
                //On windows the root (My computer) has no path so we don't want to add a / for nothing (e.g. /C:/)
                if (!path.isEmpty()) {
                    if (path.endsWith(u'/'))
                        child->updateIcon(iconProvider, path + child->fileName);
                    else
                        child->updateIcon(iconProvider, path + u'/' + child->fileName);
                } else
                    child->updateIcon(iconProvider, child->fileName);
            }
        }